

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void kj::anon_unknown_0::setNonblocking(int fd)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_30;
  Fault f;
  SyscallResult local_14;
  undefined4 local_10;
  SyscallResult _kjSyscallResult;
  int opt;
  int fd_local;
  
  local_10 = 1;
  f.exception = (Exception *)&_kjSyscallResult;
  _kjSyscallResult.errorNumber = fd;
  local_14 = kj::_::Debug::syscall<kj::(anonymous_namespace)::setNonblocking(int)::__0>
                       ((anon_class_16_2_74ab7000 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_14);
  kj::_::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x51,osErrorNumber,"ioctl(fd, FIONBIO, &opt)","");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

static void setNonblocking(int fd) {
  int flags;
  KJ_SYSCALL(flags = fcntl(fd, F_GETFL));
  if ((flags & O_NONBLOCK) == 0) {
    KJ_SYSCALL(fcntl(fd, F_SETFL, flags | O_NONBLOCK));
  }
}